

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isTaggedUnion(Type *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  PackedUnionType *pPVar3;
  UnpackedUnionType *pUVar4;
  Type *ct;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  bool local_1;
  
  pTVar2 = getCanonicalType((Type *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  SVar1 = (pTVar2->super_Symbol).kind;
  if (SVar1 == PackedUnionType) {
    pPVar3 = Symbol::as<slang::ast::PackedUnionType>((Symbol *)0x58902f);
    local_1 = (bool)(pPVar3->isTagged & 1);
  }
  else if (SVar1 == UnpackedUnionType) {
    pUVar4 = Symbol::as<slang::ast::UnpackedUnionType>((Symbol *)0x589047);
    local_1 = (bool)(pUVar4->isTagged & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Type::isTaggedUnion() const {
    auto& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::PackedUnionType:
            return ct.as<PackedUnionType>().isTagged;
        case SymbolKind::UnpackedUnionType:
            return ct.as<UnpackedUnionType>().isTagged;
        default:
            return false;
    }
}